

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenEnum(GoGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  EnumVal *ev_2;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_60;
  const_iterator it_2;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_48;
  const_iterator it_1;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_30;
  const_iterator it;
  size_t max_name_length;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    it._M_current = (EnumVal **)MaxNameLength(enum_def);
    this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    GenEnumType(this,enum_def,code_ptr);
    BeginEnum(this,code_ptr);
    pvVar2 = EnumDef::Vals(enum_def);
    local_30._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_30);
      it_1._M_current = (EnumVal **)*ppEVar3;
      GenComment(&((EnumVal *)it_1._M_current)->doc_comment,code_ptr,(CommentConfig *)0x0,"\t");
      EnumMember(this,enum_def,(EnumVal *)it_1._M_current,(size_t)it._M_current,code_ptr);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_30);
    }
    EndEnum(this,code_ptr);
    BeginEnumNames(this,enum_def,code_ptr);
    pvVar2 = EnumDef::Vals(enum_def);
    local_48._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev_1 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar2);
      bVar1 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_1);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_48);
      it_2._M_current = (EnumVal **)*ppEVar3;
      EnumNameMember(this,enum_def,(EnumVal *)it_2._M_current,(size_t)it._M_current,code_ptr);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_48);
    }
    EndEnumNames(this,code_ptr);
    BeginEnumValues(this,enum_def,code_ptr);
    pvVar2 = EnumDef::Vals(enum_def);
    local_60._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev_2 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar2);
      bVar1 = __gnu_cxx::operator!=
                        (&local_60,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_2);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_60);
      EnumValueMember(this,enum_def,*ppEVar3,(size_t)it._M_current,code_ptr);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_60);
    }
    EndEnumValues(this,code_ptr);
    EnumStringer(this,enum_def,code_ptr);
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;

    auto max_name_length = MaxNameLength(enum_def);
    cur_name_space_ = enum_def.defined_namespace;

    GenComment(enum_def.doc_comment, code_ptr, nullptr);
    GenEnumType(enum_def, code_ptr);
    BeginEnum(code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "\t");
      EnumMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnum(code_ptr);

    BeginEnumNames(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      EnumNameMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnumNames(code_ptr);

    BeginEnumValues(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      EnumValueMember(enum_def, ev, max_name_length, code_ptr);
    }
    EndEnumValues(code_ptr);

    EnumStringer(enum_def, code_ptr);
  }